

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O3

float16 float16_muladd_m68k(float16 a,float16 b,float16 c,int flags,float_status *status)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  byte bVar5;
  uint uVar6;
  undefined4 in_register_0000000c;
  uint uVar7;
  int count;
  ulong uVar8;
  ulong uVar9;
  uint64_t uVar10;
  ulong uVar11;
  uint64_t a0;
  long lVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  FloatParts FVar21;
  FloatParts FVar22;
  FloatParts FVar23;
  FloatParts p;
  FloatParts b_00;
  uint64_t c_lo;
  uint64_t c_hi;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  ulong local_60;
  ulong local_58;
  uint64_t local_50;
  uint64_t local_48;
  ulong local_40;
  ulong local_38;
  
  local_58 = CONCAT44(in_register_0000000c,flags);
  FVar21._8_8_ = (ulong)(a >> 10 & 0x1f) | (ulong)(a & 0x8000) << 0x19;
  FVar21.frac = (ulong)(a & 0x3ff);
  FVar21 = sf_canonicalize(FVar21,&float16_params,status);
  uVar8 = FVar21._8_8_;
  uVar20 = FVar21.frac;
  FVar22.frac = (ulong)(b & 0x3ff);
  FVar22._8_8_ = (ulong)(b >> 10 & 0x1f) | (ulong)(b & 0x8000) << 0x19;
  FVar22 = sf_canonicalize(FVar22,&float16_params,status);
  local_40 = FVar22.frac;
  FVar23._8_8_ = (ulong)(c >> 10 & 0x1f) | (ulong)(c & 0x8000) << 0x19;
  FVar23.frac = (ulong)(c & 0x3ff);
  FVar23 = sf_canonicalize(FVar23,&float16_params,status);
  uVar18 = FVar23.frac;
  if (((((undefined1  [16])FVar21 & (undefined1  [16])0xfc00000000) != (undefined1  [16])0x0) ||
      (((undefined1  [16])FVar22 & (undefined1  [16])0xfc00000000) != (undefined1  [16])0x0)) ||
     (((undefined1  [16])FVar23 & (undefined1  [16])0xfc00000000) != (undefined1  [16])0x0)) {
    uVar20 = FVar22._8_8_ & 0xffffffffffff;
    b_00.exp = (int)uVar20;
    b_00.cls = (char)(uVar20 >> 0x20);
    b_00.sign = (_Bool)(char)(uVar20 >> 0x28);
    b_00._14_2_ = (short)(uVar20 >> 0x30);
    b_00.frac = local_40;
    p = pick_nan_muladd(FVar21,b_00,FVar23,SUB81(status,0),
                        (float_status *)
                        CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    goto LAB_006c07c9;
  }
  uVar6 = FVar22._12_4_ & 0xff;
  uVar7 = FVar21._12_4_ & 0xff;
  if ((1 << (FVar22.cls & 0x1f) | 1 << (FVar21._12_4_ & 0x1f)) == 10) {
LAB_006c0680:
    p.exp = 0x7fffffff;
    p.cls = float_class_qnan;
    p.sign = false;
    p._14_2_ = 0;
    p.frac = 0x3fffffffffffffff;
    status->float_exception_flags = status->float_exception_flags | 1;
    goto LAB_006c07c9;
  }
  uVar14 = (uint)local_58;
  uVar15 = uVar14 & 4;
  uVar19 = 0x10000000000;
  uVar17 = FVar23._8_8_ & 0xffff0103ffffffff ^ 0x10000000000;
  if ((local_58 & 1) == 0) {
    uVar17 = FVar23._8_8_;
  }
  uVar4 = (FVar22._8_8_ ^ uVar8) & 0x10000000000;
  uVar9 = (ulong)(uVar4 == 0);
  if ((local_58 & 2) == 0) {
    uVar9 = uVar4 >> 0x28;
  }
  uVar13 = (uint)uVar9;
  uVar2 = (uint)(uVar17 >> 0x20);
  if ((uVar7 == 3) || (uVar6 == 3)) {
    if ((~uVar17 & 0x300000000) == 0) {
      uVar6 = uVar2 >> 8 & 1;
      if (uVar6 == uVar13) goto LAB_006c0774;
      goto LAB_006c0680;
    }
    if (uVar15 >> 2 == uVar13) {
      uVar19 = 0;
    }
    uVar19 = uVar19 | uVar8 & 0xffff0000ffffffff | 0x300000000;
LAB_006c07c4:
    p.exp = (int)uVar19;
    p.cls = (char)(uVar19 >> 0x20);
    p.sign = (_Bool)(char)(uVar19 >> 0x28);
    p._14_2_ = (short)(uVar19 >> 0x30);
    p.frac = uVar20;
    goto LAB_006c07c9;
  }
  uVar3 = uVar2 & 3;
  if (uVar3 == 3) {
    uVar6 = uVar2 >> 8 & 1;
LAB_006c0774:
    if (uVar6 == uVar15 >> 2) {
      uVar19 = 0;
    }
    uVar19 = uVar19 | uVar8 & 0xffff0000ffffffff | 0x300000000;
    goto LAB_006c07c4;
  }
  uVar16 = (uint)uVar17;
  if ((uVar7 == 1) || (uVar6 == 1)) {
    if (uVar3 == 1) {
      if ((uVar2 >> 8 & 1) != uVar13) {
        uVar9 = (ulong)(status->float_rounding_mode == '\x01');
      }
      uVar17 = uVar17 & 0xffff0003ffffffff | uVar9 << 0x28;
    }
    else if ((local_58 & 8) != 0) {
      uVar17 = uVar17 & 0xffffff0300000000 | (ulong)(uVar16 - 1);
    }
    if (((uint)(uVar17 >> 0x28) & 1) == uVar15 >> 2) {
      uVar19 = 0;
    }
    uVar19 = uVar19 | uVar17 & 0xffff00ffffffffff;
    p.exp = (int)uVar19;
    p.cls = (char)(uVar19 >> 0x20);
    p.sign = (_Bool)(char)(uVar19 >> 0x28);
    p._14_2_ = (short)(uVar19 >> 0x30);
    p.frac = uVar18;
    goto LAB_006c07c9;
  }
  if ((uVar7 != 2) || (uVar6 != 2)) {
    __assert_fail("a.cls == float_class_normal && b.cls == float_class_normal",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/fpu/softfloat.c"
                  ,0x58e,
                  "FloatParts muladd_floats(FloatParts, FloatParts, FloatParts, int, float_status *)"
                 );
  }
  uVar9 = (uVar20 & 0xffffffff) * (local_40 >> 0x20);
  uVar4 = (local_40 & 0xffffffff) * (uVar20 >> 0x20);
  lVar12 = 0;
  uVar11 = uVar4 + uVar9;
  if (CARRY8(uVar4,uVar9)) {
    lVar12 = 0x100000000;
  }
  uVar10 = local_40 * uVar20;
  a0 = (uVar11 >> 0x20) + (local_40 >> 0x20) * (uVar20 >> 0x20) + lVar12 +
       (ulong)(uVar10 < uVar11 << 0x20);
  uVar6 = FVar22.exp + FVar21.exp;
  if ((a0 >> 0x3d & 1) != 0) {
    uVar10 = (ulong)((uint)uVar10 & 1) | a0 << 0x3f | uVar10 >> 1;
    a0 = a0 >> 1;
    uVar6 = uVar6 + 1;
  }
  local_60 = uVar10;
  local_48 = a0;
  if (uVar3 == 1) {
    uVar10 = (ulong)((uVar10 & 0x3fffffffffffffff) != 0) | a0 << 2 | uVar10 >> 0x3e;
  }
  else {
    count = uVar6 - uVar16;
    if ((uVar2 >> 8 & 1) == uVar13) {
      if (count < 1) {
        shift128RightJamming(a0,uVar10,0x3e - count,&local_48,&local_60);
        uVar10 = uVar18 + local_60;
      }
      else {
        local_38 = uVar18 >> 2;
        local_50 = 0;
        shift128RightJamming(local_38,0,count,&local_38,&local_50);
        uVar10 = (ulong)((uVar10 + local_50 & 0x3fffffffffffffff) != 0) |
                 (a0 + local_38 + (ulong)CARRY8(uVar10,local_50)) * 4 | uVar10 + local_50 >> 0x3e;
        uVar17 = (ulong)uVar6;
      }
      uVar6 = (uint)uVar17;
      uVar14 = (uint)local_58;
      if ((long)uVar10 < 0) {
        uVar10 = (ulong)((uint)uVar10 & 1) | uVar10 >> 1;
        uVar6 = uVar6 + 1;
      }
    }
    else {
      uVar18 = uVar18 >> 2;
      local_50 = 0;
      local_38 = uVar18;
      if (count < 1) {
        shift128RightJamming(a0,uVar10,-count,&local_48,&local_60);
        if ((uVar6 == uVar16) && (uVar4 = local_48 - uVar18, uVar9 = local_60, uVar18 <= local_48))
        goto LAB_006c0ab2;
        uVar9 = -local_60;
        uVar4 = (uVar18 - local_48) - (ulong)(local_60 != 0);
        uVar13 = (uint)(byte)((byte)uVar13 ^ 1);
      }
      else {
        shift128RightJamming(uVar18,0,count,&local_38,&local_50);
        uVar4 = (a0 - local_38) - (ulong)(uVar10 < local_50);
        uVar9 = uVar10 - local_50;
LAB_006c0ab2:
        uVar17 = (ulong)uVar6;
      }
      if (uVar4 == 0 && uVar9 == 0) {
        if (uVar15 >> 2 == (uint)(status->float_rounding_mode == '\x01')) {
          uVar19 = 0;
        }
        uVar19 = (uVar19 | uVar8 & 0xffff0000ffffffff) + 0x100000000;
        goto LAB_006c07c4;
      }
      uVar14 = (uint)local_58;
      if (uVar4 == 0) {
        if (uVar9 == 0) {
          uVar20 = 0x40;
        }
        else {
          uVar20 = 0x3f;
          if (uVar9 != 0) {
            for (; uVar9 >> uVar20 == 0; uVar20 = uVar20 - 1) {
            }
          }
          uVar20 = uVar20 ^ 0x3f;
        }
        if (uVar20 == 0) {
          uVar6 = 0x40;
          goto LAB_006c0ad8;
        }
        uVar6 = (int)uVar20 + 0x40;
        uVar10 = uVar9 << ((char)uVar20 - 1U & 0x3f);
      }
      else {
        lVar12 = 0x3f;
        if (uVar4 != 0) {
          for (; uVar4 >> lVar12 == 0; lVar12 = lVar12 + -1) {
          }
        }
        uVar6 = (uint)lVar12 ^ 0x3f;
LAB_006c0ad8:
        bVar5 = (char)uVar6 - 1;
        bVar1 = bVar5 & 0x3f;
        uVar10 = (ulong)(uVar9 << (bVar5 & 0x3f) != 0) | uVar4 << bVar1 | uVar9 >> 0x40 - bVar1;
      }
      uVar6 = ((int)uVar17 - uVar6) + 3;
    }
  }
  if (uVar15 >> 2 == (uVar13 & 0xff)) {
    uVar19 = 0;
  }
  uVar20 = uVar19 | uVar8 & 0xffff000000000000 | (ulong)(((int)(uVar14 << 0x1c) >> 0x1f) + uVar6) |
           0x200000000;
  p.exp = (int)uVar20;
  p.cls = (char)(uVar20 >> 0x20);
  p.sign = (_Bool)(char)(uVar20 >> 0x28);
  p._14_2_ = (short)(uVar20 >> 0x30);
  p.frac = uVar10;
LAB_006c07c9:
  FVar21 = round_canonical(p,status,&float16_params);
  return (ushort)FVar21.frac & 0x3ff | (ushort)((FVar21.exp & 0x1fU) << 10) |
         (ushort)(FVar21._8_8_ >> 0x19) & 0x8000;
}

Assistant:

float16 QEMU_FLATTEN float16_muladd(float16 a, float16 b, float16 c,
                                                int flags, float_status *status)
{
    FloatParts pa = float16_unpack_canonical(a, status);
    FloatParts pb = float16_unpack_canonical(b, status);
    FloatParts pc = float16_unpack_canonical(c, status);
    FloatParts pr = muladd_floats(pa, pb, pc, flags, status);

    return float16_round_pack_canonical(pr, status);
}